

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

double time_oc<trng::yarn5s>(yarn5s *r)

{
  long lVar1;
  long lVar2;
  ret_t rVar3;
  string res;
  double local_48;
  string local_40;
  double local_20;
  
  local_48 = 0.0;
  lVar2 = 0x1000000;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    rVar3 = trng::utility::u01xx_traits<double,_1UL,_trng::yarn5s>::addin(r);
    local_48 = local_48 + rVar3 * -4.656661968437782e-10 + 1.0;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar2 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return local_48;
}

Assistant:

double time_oc(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformoc<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}